

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateTypeLiteral(ExpressionEvalContext *ctx,ExprTypeLiteral *expression)

{
  ExprTypeLiteral *this;
  ExprBase *pEVar1;
  ExprTypeLiteral *expression_local;
  ExpressionEvalContext *ctx_local;
  
  this = ExpressionContext::get<ExprTypeLiteral>(ctx->ctx);
  ExprTypeLiteral::ExprTypeLiteral
            (this,(expression->super_ExprBase).source,(expression->super_ExprBase).type,
             expression->value);
  pEVar1 = CheckType(&expression->super_ExprBase,&this->super_ExprBase);
  return pEVar1;
}

Assistant:

ExprBase* EvaluateTypeLiteral(ExpressionEvalContext &ctx, ExprTypeLiteral *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, expression->type, expression->value));
}